

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

VariableID __thiscall spirv_cross::Compiler::build_dummy_sampler_for_combined_images(Compiler *this)

{
  undefined8 uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  bool bVar4;
  bool bVar5;
  undefined2 uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  Dim DVar9;
  bool bVar10;
  undefined1 uVar11;
  ImageFormat IVar12;
  AccessQualifier AVar13;
  TypeID TVar14;
  TypeID TVar15;
  uint32_t id;
  SPIRFunction *func;
  SPIRType *pSVar16;
  SPIRType *pSVar17;
  ID id_00;
  uint32_t ptr_type_id;
  DummySamplerForCombinedImageHandler handler;
  uint32_t local_7c;
  ParsedIR *local_78;
  int local_6c;
  string local_68;
  OpcodeHandler local_48;
  Compiler *local_40;
  char local_38;
  
  local_48._vptr_OpcodeHandler = (_func_int **)&PTR__OpcodeHandler_0035d5f8;
  local_38 = '\0';
  local_40 = this;
  func = Variant::get<spirv_cross::SPIRFunction>
                   ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                    (this->ir).default_entry_point.id);
  traverse_all_reachable_opcodes(this,func,&local_48);
  id_00.id = 0;
  if (local_38 == '\x01') {
    local_78 = &this->ir;
    id = ParsedIR::increase_bound_by(local_78,3);
    id_00.id = id + 2;
    local_68._M_dataplus._M_p._0_4_ = 0x1a;
    local_7c = id + 1;
    pSVar16 = set<spirv_cross::SPIRType,spv::Op>(this,id,(Op *)&local_68);
    pSVar16->basetype = Sampler;
    local_68._M_dataplus._M_p._0_4_ = 0x20;
    pSVar17 = set<spirv_cross::SPIRType,spv::Op>(this,id + 1,(Op *)&local_68);
    (pSVar17->super_IVariant).self.id = (pSVar16->super_IVariant).self.id;
    uVar2 = pSVar16->width;
    uVar3 = pSVar16->vecsize;
    *(undefined8 *)&(pSVar17->super_IVariant).field_0xc =
         *(undefined8 *)&(pSVar16->super_IVariant).field_0xc;
    pSVar17->width = uVar2;
    pSVar17->vecsize = uVar3;
    pSVar17->columns = pSVar16->columns;
    SmallVector<unsigned_int,_8UL>::operator=(&pSVar17->array,&pSVar16->array);
    SmallVector<bool,_8UL>::operator=(&pSVar17->array_size_literal,&pSVar16->array_size_literal);
    bVar4 = pSVar16->pointer;
    bVar5 = pSVar16->forward_pointer;
    uVar6 = *(undefined2 *)&pSVar16->field_0x7e;
    uVar2 = (pSVar16->cooperative).use_id;
    uVar3 = (pSVar16->cooperative).rows_id;
    uVar7 = (pSVar16->cooperative).rows_id;
    uVar8 = (pSVar16->cooperative).columns_id;
    uVar1 = *(undefined8 *)&(pSVar16->cooperative).scope_id;
    pSVar17->pointer_depth = pSVar16->pointer_depth;
    pSVar17->pointer = bVar4;
    pSVar17->forward_pointer = bVar5;
    *(undefined2 *)&pSVar17->field_0x7e = uVar6;
    (pSVar17->cooperative).use_id = uVar2;
    (pSVar17->cooperative).rows_id = uVar3;
    (pSVar17->cooperative).rows_id = uVar7;
    (pSVar17->cooperative).columns_id = uVar8;
    *(undefined8 *)&(pSVar17->cooperative).scope_id = uVar1;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
              (&pSVar17->member_types,&pSVar16->member_types);
    SmallVector<unsigned_int,_8UL>::operator=
              (&pSVar17->member_type_index_redirection,&pSVar16->member_type_index_redirection);
    DVar9 = (pSVar16->image).dim;
    bVar4 = (pSVar16->image).depth;
    bVar5 = (pSVar16->image).arrayed;
    bVar10 = (pSVar16->image).ms;
    uVar11 = (pSVar16->image).field_0xb;
    uVar2 = (pSVar16->image).sampled;
    IVar12 = (pSVar16->image).format;
    AVar13 = (pSVar16->image).access;
    TVar14.id = (pSVar16->type_alias).id;
    TVar15.id = (pSVar16->parent_type).id;
    (pSVar17->image).type = (TypeID)(pSVar16->image).type.id;
    (pSVar17->image).dim = DVar9;
    (pSVar17->image).depth = bVar4;
    (pSVar17->image).arrayed = bVar5;
    (pSVar17->image).ms = bVar10;
    (pSVar17->image).field_0xb = uVar11;
    (pSVar17->image).sampled = uVar2;
    (pSVar17->image).format = IVar12;
    (pSVar17->image).access = AVar13;
    pSVar17->type_alias = (TypeID)TVar14.id;
    pSVar17->parent_type = (TypeID)TVar15.id;
    if (pSVar16 != pSVar17) {
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&pSVar17->member_name_cache,&(pSVar16->member_name_cache)._M_h);
    }
    (pSVar17->super_IVariant).self.id = id;
    pSVar17->storage = StorageClassUniformConstant;
    pSVar17->pointer = true;
    (pSVar17->parent_type).id = id;
    local_68._M_dataplus._M_p = local_68._M_dataplus._M_p & 0xffffffff00000000;
    local_6c = 0;
    set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int>
              (this,id_00.id,&local_7c,(StorageClass *)&local_68,&local_6c);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"SPIRV_Cross_DummySampler","");
    ParsedIR::set_name(local_78,id_00,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    this->dummy_sampler_id = id_00.id;
  }
  return (VariableID)id_00.id;
}

Assistant:

VariableID Compiler::build_dummy_sampler_for_combined_images()
{
	DummySamplerForCombinedImageHandler handler(*this);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);
	if (handler.need_dummy_sampler)
	{
		uint32_t offset = ir.increase_bound_by(3);
		auto type_id = offset + 0;
		auto ptr_type_id = offset + 1;
		auto var_id = offset + 2;

		auto &sampler = set<SPIRType>(type_id, OpTypeSampler);
		sampler.basetype = SPIRType::Sampler;

		auto &ptr_sampler = set<SPIRType>(ptr_type_id, OpTypePointer);
		ptr_sampler = sampler;
		ptr_sampler.self = type_id;
		ptr_sampler.storage = StorageClassUniformConstant;
		ptr_sampler.pointer = true;
		ptr_sampler.parent_type = type_id;

		set<SPIRVariable>(var_id, ptr_type_id, StorageClassUniformConstant, 0);
		set_name(var_id, "SPIRV_Cross_DummySampler");
		dummy_sampler_id = var_id;
		return var_id;
	}
	else
		return 0;
}